

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void roaring_bitmap_add_many(roaring_bitmap_t *r,size_t n_args,uint32_t *vals)

{
  uint32_t val;
  container_t *c;
  container_t *pcVar1;
  size_t sVar2;
  uint32_t val_00;
  uint8_t typecode;
  uint8_t newtypecode;
  int containerindex;
  uint8_t local_3e;
  uint8_t local_3d;
  int local_3c;
  roaring_bitmap_t *local_38;
  
  local_3e = '\0';
  local_3c = 0;
  if (n_args != 0) {
    val_00 = *vals;
    local_38 = r;
    c = containerptr_roaring_bitmap_add(r,val_00,&local_3e,&local_3c);
    if (n_args != 1) {
      sVar2 = 1;
      do {
        val = vals[sVar2];
        if ((val_00 ^ val) < 0x10000) {
          local_3d = local_3e;
          pcVar1 = container_add(c,(uint16_t)val,local_3e,&local_3d);
          if (pcVar1 != c) {
            container_free(c,local_3e);
            if ((local_38->high_low_container).size <= local_3c) {
              __assert_fail("i < ra->size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                            ,0x1a3a,
                            "void ra_set_container_at_index(const roaring_array_t *, int32_t, container_t *, uint8_t)"
                           );
            }
            (local_38->high_low_container).containers[local_3c] = pcVar1;
            (local_38->high_low_container).typecodes[local_3c] = local_3d;
            local_3e = local_3d;
            c = pcVar1;
          }
        }
        else {
          c = containerptr_roaring_bitmap_add(local_38,val,&local_3e,&local_3c);
        }
        sVar2 = sVar2 + 1;
        val_00 = val;
      } while (n_args != sVar2);
    }
  }
  return;
}

Assistant:

void roaring_bitmap_add_many(roaring_bitmap_t *r, size_t n_args,
                             const uint32_t *vals) {
    container_t *container = NULL;  // hold value of last container touched
    uint8_t typecode = 0;    // typecode of last container touched
    uint32_t prev = 0;       // previous valued inserted
    size_t i = 0;            // index of value
    int containerindex = 0;
    if (n_args == 0) return;
    uint32_t val;
    memcpy(&val, vals + i, sizeof(val));
    container =
        containerptr_roaring_bitmap_add(r, val, &typecode, &containerindex);
    prev = val;
    i++;
    for (; i < n_args; i++) {
        memcpy(&val, vals + i, sizeof(val));
        if (((prev ^ val) >> 16) ==
            0) {  // no need to seek the container, it is at hand
            // because we already have the container at hand, we can do the
            // insertion
            // automatically, bypassing the roaring_bitmap_add call
            uint8_t newtypecode = typecode;
            container_t *container2 =
                container_add(container, val & 0xFFFF, typecode, &newtypecode);
            if (container2 != container) {  // rare instance when we need to
                                            // change the container type
                container_free(container, typecode);
                ra_set_container_at_index(&r->high_low_container,
                                          containerindex, container2,
                                          newtypecode);
                typecode = newtypecode;
                container = container2;
            }
        } else {
            container = containerptr_roaring_bitmap_add(r, val, &typecode,
                                                        &containerindex);
        }
        prev = val;
    }
}